

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int discard_sentmap_by_epoch(quicly_conn_t *conn,uint ack_epochs)

{
  uint uVar1;
  int iVar2;
  quicly_sent_packet_t *pqVar3;
  quicly_sentmap_iter_t iter;
  
  iVar2 = init_acks_iter(conn,&iter);
  if (iVar2 == 0) {
    do {
      while( true ) {
        pqVar3 = quicly_sentmap_get(&iter);
        if (pqVar3->packet_number == 0xffffffffffffffff) {
          return 0;
        }
        uVar1._0_1_ = pqVar3->ack_epoch;
        uVar1._1_1_ = pqVar3->field_0x11;
        uVar1._2_2_ = pqVar3->cc_bytes_in_flight;
        if ((ack_epochs >> (uVar1 & 0x1f) & 1) != 0) break;
        quicly_sentmap_skip(&iter);
      }
      iVar2 = quicly_sentmap_update(&(conn->egress).loss.sentmap,&iter,QUICLY_SENTMAP_EVENT_EXPIRED)
      ;
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

int discard_sentmap_by_epoch(quicly_conn_t *conn, unsigned ack_epochs)
{
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;
    int ret;

    if ((ret = init_acks_iter(conn, &iter)) != 0)
        return ret;

    while ((sent = quicly_sentmap_get(&iter))->packet_number != UINT64_MAX) {
        if ((ack_epochs & (1u << sent->ack_epoch)) != 0) {
            if ((ret = quicly_sentmap_update(&conn->egress.loss.sentmap, &iter, QUICLY_SENTMAP_EVENT_EXPIRED)) != 0)
                return ret;
        } else {
            quicly_sentmap_skip(&iter);
        }
    }

    return ret;
}